

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32.cpp
# Opt level: O0

string * bech32::Encode(Encoding encoding,string *hrp,data *values)

{
  long lVar1;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  undefined8 in_RCX;
  string *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  uint8_t *i_1;
  data *__range1_2;
  uint8_t *i;
  data *__range1_1;
  char *c;
  string *__range1;
  string *ret;
  iterator __end1_2;
  iterator __begin1_2;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  const_iterator __end1;
  const_iterator __begin1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff18;
  undefined7 in_stack_ffffffffffffff20;
  char in_stack_ffffffffffffff27;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  size_type in_stack_ffffffffffffff48;
  data *in_stack_ffffffffffffff80;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
            (in_stack_ffffffffffffff18);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
            (in_stack_ffffffffffffff28);
  while (bVar2 = __gnu_cxx::
                 operator==<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)in_stack_ffffffffffffff28,
                            (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20)),
        ((bVar2 ^ 0xffU) & 1) != 0) {
    in_stack_ffffffffffffff80 =
         (data *)__gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)in_stack_ffffffffffffff18);
    in_stack_ffffffffffffff37 = true;
    if ('@' < *(char *)&(in_stack_ffffffffffffff80->
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                        super__Vector_impl_data._M_start) {
      in_stack_ffffffffffffff37 =
           'Z' < *(char *)&(in_stack_ffffffffffffff80->
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_start;
    }
    if ((bool)in_stack_ffffffffffffff37 == false) {
      __assert_fail("c < \'A\' || c > \'Z\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/bech32.cpp"
                    ,0x16a,"std::string bech32::Encode(Encoding, const std::string &, const data &)"
                   );
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_ffffffffffffff18);
  }
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                   (in_stack_ffffffffffffff18);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff18);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            (in_RDI,in_stack_ffffffffffffff48);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            (this,in_stack_ffffffffffffff27);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
  while (bVar2 = __gnu_cxx::
                 operator==<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                             *)this,(__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                     *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20)
                           ), ((bVar2 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator*((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)in_stack_ffffffffffffff18);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (this,in_stack_ffffffffffffff27);
    __gnu_cxx::
    __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator++((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)in_stack_ffffffffffffff18);
  }
  anon_unknown_0::CreateChecksum((Encoding)((ulong)in_RCX >> 0x20),in_RDX,in_stack_ffffffffffffff80)
  ;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
  while (bVar2 = __gnu_cxx::
                 operator==<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                             *)this,(__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                     *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20)
                           ), ((bVar2 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator*((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)in_stack_ffffffffffffff18);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (this,in_stack_ffffffffffffff27);
    __gnu_cxx::
    __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator++((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)in_stack_ffffffffffffff18);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

std::string Encode(Encoding encoding, const std::string& hrp, const data& values) {
    // First ensure that the HRP is all lowercase. BIP-173 and BIP350 require an encoder
    // to return a lowercase Bech32/Bech32m string, but if given an uppercase HRP, the
    // result will always be invalid.
    for (const char& c : hrp) assert(c < 'A' || c > 'Z');

    std::string ret;
    ret.reserve(hrp.size() + 1 + values.size() + CHECKSUM_SIZE);
    ret += hrp;
    ret += '1';
    for (const uint8_t& i : values) ret += CHARSET[i];
    for (const uint8_t& i : CreateChecksum(encoding, hrp, values)) ret += CHARSET[i];
    return ret;
}